

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cc
# Opt level: O1

window * __thiscall hmi::window::operator=(window *this,window *other)

{
  bool bVar1;
  SDL_Window *pSVar2;
  
  pSVar2 = this->m_window;
  this->m_window = other->m_window;
  other->m_window = pSVar2;
  bVar1 = this->m_should_close;
  this->m_should_close = other->m_should_close;
  other->m_should_close = bVar1;
  LOCK();
  (anonymous_namespace)::g_loaded = (anonymous_namespace)::g_loaded + 1;
  UNLOCK();
  return this;
}

Assistant:

window& window::operator=(window&& other) {
    std::swap(m_window, other.m_window);
    std::swap(m_should_close, other.m_should_close);
    g_loaded.fetch_add(1);
    return *this;
  }